

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O1

void __thiscall Gecko::Subgraph::optimize(Subgraph *this,uint p)

{
  Subnode *pSVar1;
  long lVar2;
  float fVar3;
  Graph *pGVar4;
  WeightedValue WVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  pointer pNVar11;
  Graph *pGVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint i;
  byte bVar16;
  char cVar17;
  long lVar18;
  uint uVar19;
  Float (*paFVar20) [16];
  Index *pIVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> external;
  uint local_74;
  float local_70;
  int local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  ulong local_50;
  long local_48;
  Float (*local_40) [16];
  ulong local_38;
  
  pNVar11 = (this->g->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = (this->g->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[p];
  local_70 = pNVar11[uVar7].pos - pNVar11[uVar7].hlen;
  (this->min).super_WeightedValue = (WeightedValue)0x3f8000007f7fffff;
  i = this->n;
  if (i != 0) {
    paFVar20 = this->weight;
    cVar17 = '\0';
    uVar10 = 0;
    uVar8 = 0;
    local_40 = paFVar20;
    do {
      uVar14 = uVar8 & 0xff;
      this->perm[uVar14] = (Index)uVar8;
      this->best[uVar14] = (Index)uVar8;
      pGVar4 = this->g;
      uVar7 = (pGVar4->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[(int)uVar10 + p];
      this->adj[uVar14] = 0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      pGVar12 = this->g;
      pNVar11 = (pGVar12->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_48 = (ulong)uVar7 << 4;
      local_50 = uVar10;
      for (local_74 = (pGVar4->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar7 - 1].arc;
          local_74 < *(uint *)((long)&pNVar11->arc + local_48); local_74 = local_74 + 1) {
        uVar7 = this->n;
        if (uVar7 == 0) {
          uVar8 = 0;
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          bVar16 = 0;
          do {
            if ((pGVar12->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9 + p] ==
                (pGVar12->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[local_74]) break;
            bVar16 = bVar16 + 1;
            uVar9 = (uint)bVar16;
          } while (uVar9 < uVar7);
          uVar8 = (ulong)bVar16;
        }
        if (uVar7 == uVar9) {
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_74);
          }
          else {
            *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_74;
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          this->adj[uVar14] = this->adj[uVar14] + (1 << ((byte)uVar9 & 0x1f));
          *(float *)((long)*paFVar20 + uVar8 * 4 + (ulong)(uint)((int)uVar14 << 6)) =
               (pGVar12->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[local_74];
        }
        pGVar12 = this->g;
        pNVar11 = (pGVar12->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      uVar19 = 1 << ((byte)local_50 & 0x1f);
      this->node[uVar14] = this->cache + ((int)local_50 << ((byte)this->n & 0x1f));
      uVar7 = this->n;
      local_6c = uVar19 - 1;
      uVar9 = 0;
      uVar8 = local_50;
      local_38 = uVar14;
      do {
        if ((uVar9 & uVar19) == 0) {
          pSVar1 = this->cache + (long)((int)uVar8 << ((byte)uVar7 & 0x1f)) + (ulong)uVar9;
          pGVar4 = this->g;
          pNVar11 = (pGVar4->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar1->pos = *(float *)((long)&pNVar11->hlen + local_48) + local_70;
          if (uVar7 != 0) {
            uVar15 = 0;
            uVar6 = 1;
            do {
              if (((char)(cVar17 + (char)uVar6) != '\x01') && ((uVar9 >> (uVar15 & 0x1f) & 1) == 0))
              {
                fVar3 = pNVar11[(pGVar4->perm).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar15 + p]].hlen;
                pSVar1->pos = fVar3 + fVar3 + pSVar1->pos;
              }
              uVar15 = uVar6 & 0xff;
              uVar6 = uVar15 + 1;
            } while (uVar15 < uVar7);
          }
          WVar5 = (WeightedValue)Graph::cost(pGVar4,&local_68,pSVar1->pos);
          (pSVar1->cost).super_WeightedValue = WVar5;
          uVar8 = local_50;
        }
        else {
          uVar9 = uVar9 + local_6c;
        }
        uVar10 = local_38;
        paFVar20 = local_40;
        uVar9 = uVar9 + 1;
        uVar7 = this->n;
        uVar6 = 1 << ((byte)uVar7 & 0x1f);
      } while (uVar9 < uVar6);
      this->node[local_38] = this->node[local_38] + (uVar6 + (-2 << ((byte)uVar8 & 0x1f)));
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar7 = (int)uVar10 + 1;
      uVar8 = (ulong)uVar7;
      uVar10 = (ulong)(byte)uVar7;
      i = this->n;
      cVar17 = cVar17 + -1;
    } while ((uVar7 & 0xff) < i);
  }
  optimize(this,(WeightedSum)0x0,i);
  if (this->n != 0) {
    pIVar21 = this->best;
    lVar18 = 1;
    uVar8 = 0;
    do {
      pIVar21 = pIVar21 + 1;
      Graph::swap(this->g,(int)uVar8 + p,this->best[uVar8] + p);
      uVar10 = uVar8 + 1;
      if (uVar10 < this->n) {
        uVar7 = this->n;
        lVar13 = 0;
        do {
          if (uVar8 == pIVar21[lVar13]) {
            pIVar21[lVar13] = this->best[uVar8];
          }
          lVar2 = lVar18 + lVar13;
          lVar13 = lVar13 + 1;
        } while (lVar2 + 1U < (ulong)uVar7);
      }
      lVar18 = lVar18 + 1;
      uVar8 = uVar10;
    } while (uVar10 < this->n);
  }
  return;
}

Assistant:

void
Subgraph::optimize(uint p)
{
  // Initialize subgraph.
  const Float q = g->node[g->perm[p]].pos - g->node[g->perm[p]].hlen;
  min = WeightedSum(GECKO_FLOAT_MAX, 1);
  for (Subnode::Index k = 0; k < n; k++) {
    best[k] = perm[k] = k;
    Node::Index i = g->perm[p + k];
    // Copy i's outgoing arcs.  We distinguish between internal
    // and external arcs to nodes within and outside the subgraph,
    // respectively.
#if GECKO_WITH_ADJLIST
    uint m = 0;
#else
    adj[k] = 0;
#endif
    std::vector<Arc::Index> external;
    for (Arc::Index a = g->node_begin(i); a < g->node_end(i); a++) {
      Node::Index j = g->adj[a];
      Subnode::Index l;
      for (l = 0; l < n && g->perm[p + l] != j; l++);
      if (l == n)
        external.push_back(a);
      else {
        // Copy internal arc to subgraph.
#if GECKO_WITH_ADJLIST
        adj[k][m] = l;
        weight[k][m] = g->weight[a];
        m++;
#else
        adj[k] += 1u << l;
        weight[k][l] = g->weight[a];
#endif
      }
    }
#if GECKO_WITH_ADJLIST
    adj[k][m] = k;
#endif
    // Precompute external costs associated with all possible positions
    // of this node.  Since node lengths can be arbitrary, there are as
    // many as 2^(n-1) possible positions, each corresponding to an
    // (n-1)-bit string that specifies whether the remaining n-1 nodes
    // succeed this node or not.  Caching the
    //                n
    //   2^(n-1) n = sum k C(n, k) = A001787
    //               k=1
    // external costs is exponentially cheaper than recomputing the
    //      n-1         n
    //   n! sum 1/k! = sum k! C(n, k) = A007526
    //      k=0        k=1
    // costs associated with all permutations.
    node[k] = cache + (k << n);
    for (uint m = 0; m < (1u << n); m++)
      if (!(m & (1u << k))) {
        Subnode* s = cache + (k << n) + m;
        s->pos = q + g->node[i].hlen;
        for (Subnode::Index l = 0; l < n; l++)
          if (l != k && !(m & (1u << l)))
            s->pos += 2 * g->node[g->perm[p + l]].hlen;
        s->cost = g->cost(external, s->pos);
      }
      else
        m += (1u << k) - 1;
    node[k] += (1u << n) - (2u << k);
  }

  // Find optimal permutation of the n nodes.
  optimize(0, n);

  // Apply permutation to original graph.
  for (uint i = 0; i < n; i++) {
    g->swap(p + i, p + best[i]);
    for (uint j = i + 1; j < n; j++)
      if (best[j] == i)
        best[j] = best[i];
  }
}